

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base_eval.cpp
# Opt level: O1

Vec3fa embree::avx::patchEval(SubdivPatch1Base *patch,float uu,float vv)

{
  char cVar1;
  undefined1 auVar2 [16];
  long in_RSI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar3;
  undefined1 in_register_00001204 [60];
  undefined1 auVar7 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar11 [64];
  float fVar12;
  float fVar14;
  float fVar15;
  undefined1 auVar13 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  Vec3fa VVar46;
  undefined8 uVar8;
  
  auVar11._4_60_ = in_register_00001244;
  auVar11._0_4_ = vv;
  uVar8 = auVar11._0_8_;
  auVar7._4_60_ = in_register_00001204;
  auVar7._0_4_ = uu;
  uVar3 = auVar7._0_8_;
  cVar1 = *(char *)(in_RSI + 0x2d);
  if (cVar1 == '\x02') {
    fVar12 = 1.0 - uu;
    fVar14 = 1.0 - vv;
    auVar4 = ZEXT416((uint)(uu * uu * uu));
    auVar4 = vshufps_avx(auVar4,auVar4,0);
    fVar18 = auVar4._0_4_;
    fVar19 = auVar4._4_4_;
    fVar20 = auVar4._8_4_;
    fVar21 = auVar4._12_4_;
    auVar4 = ZEXT416((uint)(uu * uu * 3.0 * fVar12));
    auVar4 = vshufps_avx(auVar4,auVar4,0);
    fVar22 = auVar4._0_4_;
    fVar23 = auVar4._4_4_;
    fVar24 = auVar4._8_4_;
    fVar25 = auVar4._12_4_;
    auVar4 = ZEXT416((uint)(uu * 3.0 * fVar12 * fVar12));
    auVar4 = vshufps_avx(auVar4,auVar4,0);
    fVar26 = auVar4._0_4_;
    fVar27 = auVar4._4_4_;
    fVar28 = auVar4._8_4_;
    fVar29 = auVar4._12_4_;
    auVar4 = ZEXT416((uint)(fVar12 * fVar12 * fVar12));
    auVar4 = vshufps_avx(auVar4,auVar4,0);
    fVar12 = auVar4._0_4_;
    fVar15 = auVar4._4_4_;
    fVar16 = auVar4._8_4_;
    fVar17 = auVar4._12_4_;
    auVar4 = ZEXT416((uint)(vv * vv * vv));
    auVar4 = vshufps_avx(auVar4,auVar4,0);
    auVar5 = ZEXT416((uint)(fVar14 * vv * vv * 3.0));
    auVar5 = vshufps_avx(auVar5,auVar5,0);
    auVar13 = ZEXT416((uint)(vv * 3.0 * fVar14 * fVar14));
    auVar13 = vshufps_avx(auVar13,auVar13,0);
    auVar9._0_4_ = auVar13._0_4_ *
                   (fVar12 * *(float *)(in_RSI + 0x80) +
                   fVar26 * *(float *)(in_RSI + 0x90) +
                   fVar22 * *(float *)(in_RSI + 0xa0) + fVar18 * *(float *)(in_RSI + 0xb0)) +
                   (fVar12 * *(float *)(in_RSI + 0xc0) +
                   fVar26 * *(float *)(in_RSI + 0xd0) +
                   fVar18 * *(float *)(in_RSI + 0xf0) + fVar22 * *(float *)(in_RSI + 0xe0)) *
                   auVar5._0_4_ +
                   auVar4._0_4_ *
                   (fVar12 * *(float *)(in_RSI + 0x100) +
                   fVar26 * *(float *)(in_RSI + 0x110) +
                   fVar22 * *(float *)(in_RSI + 0x120) + fVar18 * *(float *)(in_RSI + 0x130));
    auVar9._4_4_ = auVar13._4_4_ *
                   (fVar15 * *(float *)(in_RSI + 0x84) +
                   fVar27 * *(float *)(in_RSI + 0x94) +
                   fVar23 * *(float *)(in_RSI + 0xa4) + fVar19 * *(float *)(in_RSI + 0xb4)) +
                   (fVar15 * *(float *)(in_RSI + 0xc4) +
                   fVar27 * *(float *)(in_RSI + 0xd4) +
                   fVar19 * *(float *)(in_RSI + 0xf4) + fVar23 * *(float *)(in_RSI + 0xe4)) *
                   auVar5._4_4_ +
                   auVar4._4_4_ *
                   (fVar15 * *(float *)(in_RSI + 0x104) +
                   fVar27 * *(float *)(in_RSI + 0x114) +
                   fVar23 * *(float *)(in_RSI + 0x124) + fVar19 * *(float *)(in_RSI + 0x134));
    auVar9._8_4_ = auVar13._8_4_ *
                   (fVar16 * *(float *)(in_RSI + 0x88) +
                   fVar28 * *(float *)(in_RSI + 0x98) +
                   fVar24 * *(float *)(in_RSI + 0xa8) + fVar20 * *(float *)(in_RSI + 0xb8)) +
                   (fVar16 * *(float *)(in_RSI + 200) +
                   fVar28 * *(float *)(in_RSI + 0xd8) +
                   fVar20 * *(float *)(in_RSI + 0xf8) + fVar24 * *(float *)(in_RSI + 0xe8)) *
                   auVar5._8_4_ +
                   auVar4._8_4_ *
                   (fVar16 * *(float *)(in_RSI + 0x108) +
                   fVar28 * *(float *)(in_RSI + 0x118) +
                   fVar24 * *(float *)(in_RSI + 0x128) + fVar20 * *(float *)(in_RSI + 0x138));
    auVar9._12_4_ =
         auVar13._12_4_ *
         (fVar17 * *(float *)(in_RSI + 0x8c) +
         fVar29 * *(float *)(in_RSI + 0x9c) +
         fVar25 * *(float *)(in_RSI + 0xac) + fVar21 * *(float *)(in_RSI + 0xbc)) +
         (fVar17 * *(float *)(in_RSI + 0xcc) +
         fVar29 * *(float *)(in_RSI + 0xdc) +
         fVar21 * *(float *)(in_RSI + 0xfc) + fVar25 * *(float *)(in_RSI + 0xec)) * auVar5._12_4_ +
         auVar4._12_4_ *
         (fVar17 * *(float *)(in_RSI + 0x10c) +
         fVar29 * *(float *)(in_RSI + 0x11c) +
         fVar25 * *(float *)(in_RSI + 300) + fVar21 * *(float *)(in_RSI + 0x13c));
    auVar4 = ZEXT416((uint)(fVar14 * fVar14 * fVar14));
    auVar4 = vshufps_avx(auVar4,auVar4,0);
    auVar5._0_4_ = auVar4._0_4_ *
                   (fVar12 * *(float *)(in_RSI + 0x40) +
                   fVar26 * *(float *)(in_RSI + 0x50) +
                   fVar22 * *(float *)(in_RSI + 0x60) + fVar18 * *(float *)(in_RSI + 0x70));
    auVar5._4_4_ = auVar4._4_4_ *
                   (fVar15 * *(float *)(in_RSI + 0x44) +
                   fVar27 * *(float *)(in_RSI + 0x54) +
                   fVar23 * *(float *)(in_RSI + 100) + fVar19 * *(float *)(in_RSI + 0x74));
    auVar5._8_4_ = auVar4._8_4_ *
                   (fVar16 * *(float *)(in_RSI + 0x48) +
                   fVar28 * *(float *)(in_RSI + 0x58) +
                   fVar24 * *(float *)(in_RSI + 0x68) + fVar20 * *(float *)(in_RSI + 0x78));
    auVar5._12_4_ =
         auVar4._12_4_ *
         (fVar17 * *(float *)(in_RSI + 0x4c) +
         fVar29 * *(float *)(in_RSI + 0x5c) +
         fVar25 * *(float *)(in_RSI + 0x6c) + fVar21 * *(float *)(in_RSI + 0x7c));
LAB_015e754c:
    uVar8 = auVar9._0_8_;
    uVar3 = auVar5._0_8_;
    fVar12 = auVar5._0_4_ + auVar9._0_4_;
    fVar14 = auVar5._4_4_ + auVar9._4_4_;
    fVar15 = auVar5._8_4_ + auVar9._8_4_;
    fVar16 = auVar5._12_4_ + auVar9._12_4_;
  }
  else {
    if (cVar1 == '\x01') {
      fVar16 = 1.0 - vv;
      fVar12 = fVar16 * fVar16 * fVar16;
      fVar14 = vv * vv * vv;
      fVar15 = fVar16 * vv * fVar16;
      fVar16 = fVar16 * vv * vv;
      auVar4 = vshufps_avx(ZEXT416((uint)(fVar14 * 0.16666667)),ZEXT416((uint)(fVar14 * 0.16666667))
                           ,0);
      fVar21 = auVar4._0_4_;
      fVar22 = auVar4._4_4_;
      fVar23 = auVar4._8_4_;
      fVar24 = auVar4._12_4_;
      auVar4 = ZEXT416((uint)((fVar16 * 12.0 + fVar15 * 6.0 + fVar14 * 4.0 + fVar12) * 0.16666667));
      auVar4 = vshufps_avx(auVar4,auVar4,0);
      fVar25 = auVar4._0_4_;
      fVar26 = auVar4._4_4_;
      fVar27 = auVar4._8_4_;
      fVar28 = auVar4._12_4_;
      auVar4 = ZEXT416((uint)((fVar15 * 12.0 + fVar16 * 6.0 + fVar12 * 4.0 + fVar14) * 0.16666667));
      auVar4 = vshufps_avx(auVar4,auVar4,0);
      fVar17 = auVar4._0_4_;
      fVar18 = auVar4._4_4_;
      fVar19 = auVar4._8_4_;
      fVar20 = auVar4._12_4_;
      auVar4 = vshufps_avx(ZEXT416((uint)(fVar12 * 0.16666667)),ZEXT416((uint)(fVar12 * 0.16666667))
                           ,0);
      fVar29 = auVar4._0_4_;
      fVar38 = auVar4._4_4_;
      fVar30 = auVar4._8_4_;
      fVar31 = auVar4._12_4_;
      fVar16 = 1.0 - uu;
      fVar12 = fVar16 * fVar16 * fVar16;
      fVar14 = uu * uu * uu;
      fVar15 = fVar16 * uu * fVar16;
      fVar16 = fVar16 * uu * uu;
      auVar4 = vshufps_avx(ZEXT416((uint)(fVar14 * 0.16666667)),ZEXT416((uint)(fVar14 * 0.16666667))
                           ,0);
      auVar5 = ZEXT416((uint)((fVar12 + fVar14 * 4.0 + fVar16 * 12.0 + fVar15 * 6.0) * 0.16666667));
      auVar5 = vshufps_avx(auVar5,auVar5,0);
      auVar13 = ZEXT416((uint)((fVar12 * 4.0 + fVar14 + fVar15 * 12.0 + fVar16 * 6.0) * 0.16666667))
      ;
      auVar13 = vshufps_avx(auVar13,auVar13,0);
      auVar6._0_4_ = auVar13._0_4_ *
                     (fVar29 * *(float *)(in_RSI + 0x50) +
                     fVar17 * *(float *)(in_RSI + 0x90) +
                     fVar25 * *(float *)(in_RSI + 0xd0) + fVar21 * *(float *)(in_RSI + 0x110)) +
                     (fVar29 * *(float *)(in_RSI + 0x60) +
                     fVar17 * *(float *)(in_RSI + 0xa0) +
                     fVar21 * *(float *)(in_RSI + 0x120) + fVar25 * *(float *)(in_RSI + 0xe0)) *
                     auVar5._0_4_ +
                     (fVar29 * *(float *)(in_RSI + 0x70) +
                     fVar17 * *(float *)(in_RSI + 0xb0) +
                     fVar21 * *(float *)(in_RSI + 0x130) + fVar25 * *(float *)(in_RSI + 0xf0)) *
                     auVar4._0_4_;
      auVar6._4_4_ = auVar13._4_4_ *
                     (fVar38 * *(float *)(in_RSI + 0x54) +
                     fVar18 * *(float *)(in_RSI + 0x94) +
                     fVar26 * *(float *)(in_RSI + 0xd4) + fVar22 * *(float *)(in_RSI + 0x114)) +
                     (fVar38 * *(float *)(in_RSI + 100) +
                     fVar18 * *(float *)(in_RSI + 0xa4) +
                     fVar22 * *(float *)(in_RSI + 0x124) + fVar26 * *(float *)(in_RSI + 0xe4)) *
                     auVar5._4_4_ +
                     (fVar38 * *(float *)(in_RSI + 0x74) +
                     fVar18 * *(float *)(in_RSI + 0xb4) +
                     fVar22 * *(float *)(in_RSI + 0x134) + fVar26 * *(float *)(in_RSI + 0xf4)) *
                     auVar4._4_4_;
      auVar6._8_4_ = auVar13._8_4_ *
                     (fVar30 * *(float *)(in_RSI + 0x58) +
                     fVar19 * *(float *)(in_RSI + 0x98) +
                     fVar27 * *(float *)(in_RSI + 0xd8) + fVar23 * *(float *)(in_RSI + 0x118)) +
                     (fVar30 * *(float *)(in_RSI + 0x68) +
                     fVar19 * *(float *)(in_RSI + 0xa8) +
                     fVar23 * *(float *)(in_RSI + 0x128) + fVar27 * *(float *)(in_RSI + 0xe8)) *
                     auVar5._8_4_ +
                     (fVar30 * *(float *)(in_RSI + 0x78) +
                     fVar19 * *(float *)(in_RSI + 0xb8) +
                     fVar23 * *(float *)(in_RSI + 0x138) + fVar27 * *(float *)(in_RSI + 0xf8)) *
                     auVar4._8_4_;
      auVar6._12_4_ =
           auVar13._12_4_ *
           (fVar31 * *(float *)(in_RSI + 0x5c) +
           fVar20 * *(float *)(in_RSI + 0x9c) +
           fVar28 * *(float *)(in_RSI + 0xdc) + fVar24 * *(float *)(in_RSI + 0x11c)) +
           (fVar31 * *(float *)(in_RSI + 0x6c) +
           fVar20 * *(float *)(in_RSI + 0xac) +
           fVar24 * *(float *)(in_RSI + 300) + fVar28 * *(float *)(in_RSI + 0xec)) * auVar5._12_4_ +
           (fVar31 * *(float *)(in_RSI + 0x7c) +
           fVar20 * *(float *)(in_RSI + 0xbc) +
           fVar24 * *(float *)(in_RSI + 0x13c) + fVar28 * *(float *)(in_RSI + 0xfc)) * auVar4._12_4_
      ;
      auVar4 = vshufps_avx(ZEXT416((uint)(fVar12 * 0.16666667)),ZEXT416((uint)(fVar12 * 0.16666667))
                           ,0);
      auVar10._0_4_ =
           auVar4._0_4_ *
           (fVar29 * *(float *)(in_RSI + 0x40) +
           fVar17 * *(float *)(in_RSI + 0x80) +
           fVar25 * *(float *)(in_RSI + 0xc0) + fVar21 * *(float *)(in_RSI + 0x100));
      auVar10._4_4_ =
           auVar4._4_4_ *
           (fVar38 * *(float *)(in_RSI + 0x44) +
           fVar18 * *(float *)(in_RSI + 0x84) +
           fVar26 * *(float *)(in_RSI + 0xc4) + fVar22 * *(float *)(in_RSI + 0x104));
      auVar10._8_4_ =
           auVar4._8_4_ *
           (fVar30 * *(float *)(in_RSI + 0x48) +
           fVar19 * *(float *)(in_RSI + 0x88) +
           fVar27 * *(float *)(in_RSI + 200) + fVar23 * *(float *)(in_RSI + 0x108));
      auVar10._12_4_ =
           auVar4._12_4_ *
           (fVar31 * *(float *)(in_RSI + 0x4c) +
           fVar20 * *(float *)(in_RSI + 0x8c) +
           fVar28 * *(float *)(in_RSI + 0xcc) + fVar24 * *(float *)(in_RSI + 0x10c));
    }
    else {
      auVar4 = auVar7._0_16_;
      auVar5 = auVar11._0_16_;
      if (cVar1 == '\x03') {
        auVar13 = vshufps_avx(auVar4,auVar5,0);
        auVar13 = vcmpps_avx(auVar13,_DAT_0205a890,0);
        if ((((auVar13 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar13 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar13 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar13[0xf]
           ) {
          auVar13 = vinsertps_avx(ZEXT416(*(uint *)(in_RSI + 0x10c)),
                                  ZEXT416(*(uint *)(in_RSI + 0x11c)),0x1c);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(in_RSI + 300)),0x28);
          auVar6 = vinsertps_avx(ZEXT416(*(uint *)(in_RSI + 0xcc)),ZEXT416(*(uint *)(in_RSI + 0xdc))
                                 ,0x1c);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(in_RSI + 0xec)),0x28);
          auVar10 = vinsertps_avx(ZEXT416(*(uint *)(in_RSI + 0x8c)),
                                  ZEXT416(*(uint *)(in_RSI + 0x9c)),0x1c);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(in_RSI + 0xac)),0x28);
          auVar9 = vinsertps_avx(ZEXT416(*(uint *)(in_RSI + 0x4c)),ZEXT416(*(uint *)(in_RSI + 0x5c))
                                 ,0x1c);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(in_RSI + 0x6c)),0x28);
          auVar2 = vshufps_avx(auVar4,auVar4,0);
          auVar5 = vshufps_avx(auVar5,auVar5,0);
          fVar12 = uu + vv;
          auVar4 = vrcpss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
          auVar4 = ZEXT416((uint)(auVar4._0_4_ * (2.0 - auVar4._0_4_ * fVar12)));
          auVar4 = vshufps_avx(auVar4,auVar4,0);
          fVar12 = auVar4._0_4_ *
                   (auVar2._0_4_ * *(float *)(in_RSI + 0x90) + auVar5._0_4_ * auVar9._0_4_);
          fVar14 = auVar4._4_4_ *
                   (auVar2._4_4_ * *(float *)(in_RSI + 0x94) + auVar5._4_4_ * auVar9._4_4_);
          fVar15 = auVar4._8_4_ *
                   (auVar2._8_4_ * *(float *)(in_RSI + 0x98) + auVar5._8_4_ * auVar9._8_4_);
          fVar16 = auVar4._12_4_ *
                   (auVar2._12_4_ * *(float *)(in_RSI + 0x9c) + auVar5._12_4_ * auVar9._12_4_);
          fVar17 = 1.0 - uu;
          auVar9 = vshufps_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17),0);
          fVar17 = fVar17 + vv;
          auVar4 = vrcpss_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
          auVar4 = ZEXT416((uint)(auVar4._0_4_ * (2.0 - fVar17 * auVar4._0_4_)));
          auVar4 = vshufps_avx(auVar4,auVar4,0);
          fVar17 = auVar4._0_4_ *
                   (auVar5._0_4_ * *(float *)(in_RSI + 0xa0) + auVar9._0_4_ * auVar10._0_4_);
          fVar18 = auVar4._4_4_ *
                   (auVar5._4_4_ * *(float *)(in_RSI + 0xa4) + auVar9._4_4_ * auVar10._4_4_);
          fVar19 = auVar4._8_4_ *
                   (auVar5._8_4_ * *(float *)(in_RSI + 0xa8) + auVar9._8_4_ * auVar10._8_4_);
          fVar20 = auVar4._12_4_ *
                   (auVar5._12_4_ * *(float *)(in_RSI + 0xac) + auVar9._12_4_ * auVar10._12_4_);
          auVar5 = vshufps_avx(ZEXT416((uint)(1.0 - vv)),ZEXT416((uint)(1.0 - vv)),0);
          fVar21 = (2.0 - uu) - vv;
          auVar4 = vrcpss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
          auVar4 = ZEXT416((uint)(auVar4._0_4_ * (2.0 - fVar21 * auVar4._0_4_)));
          auVar4 = vshufps_avx(auVar4,auVar4,0);
          fVar21 = auVar4._0_4_ *
                   (auVar9._0_4_ * *(float *)(in_RSI + 0xe0) + auVar5._0_4_ * auVar6._0_4_);
          fVar22 = auVar4._4_4_ *
                   (auVar9._4_4_ * *(float *)(in_RSI + 0xe4) + auVar5._4_4_ * auVar6._4_4_);
          fVar23 = auVar4._8_4_ *
                   (auVar9._8_4_ * *(float *)(in_RSI + 0xe8) + auVar5._8_4_ * auVar6._8_4_);
          fVar24 = auVar4._12_4_ *
                   (auVar9._12_4_ * *(float *)(in_RSI + 0xec) + auVar5._12_4_ * auVar6._12_4_);
          fVar25 = (uu + 1.0) - vv;
          auVar4 = vrcpss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
          auVar4 = ZEXT416((uint)(auVar4._0_4_ * (2.0 - auVar4._0_4_ * fVar25)));
          auVar4 = vshufps_avx(auVar4,auVar4,0);
          fVar25 = (auVar2._0_4_ * auVar13._0_4_ + auVar5._0_4_ * *(float *)(in_RSI + 0xd0)) *
                   auVar4._0_4_;
          fVar26 = (auVar2._4_4_ * auVar13._4_4_ + auVar5._4_4_ * *(float *)(in_RSI + 0xd4)) *
                   auVar4._4_4_;
          fVar27 = (auVar2._8_4_ * auVar13._8_4_ + auVar5._8_4_ * *(float *)(in_RSI + 0xd8)) *
                   auVar4._8_4_;
          fVar28 = (auVar2._12_4_ * auVar13._12_4_ + auVar5._12_4_ * *(float *)(in_RSI + 0xdc)) *
                   auVar4._12_4_;
        }
        else {
          fVar12 = *(float *)(in_RSI + 0x90);
          fVar14 = *(float *)(in_RSI + 0x94);
          fVar15 = *(float *)(in_RSI + 0x98);
          fVar16 = *(float *)(in_RSI + 0x9c);
          fVar17 = *(float *)(in_RSI + 0xa0);
          fVar18 = *(float *)(in_RSI + 0xa4);
          fVar19 = *(float *)(in_RSI + 0xa8);
          fVar20 = *(float *)(in_RSI + 0xac);
          fVar25 = *(float *)(in_RSI + 0xd0);
          fVar26 = *(float *)(in_RSI + 0xd4);
          fVar27 = *(float *)(in_RSI + 0xd8);
          fVar28 = *(float *)(in_RSI + 0xdc);
          fVar21 = *(float *)(in_RSI + 0xe0);
          fVar22 = *(float *)(in_RSI + 0xe4);
          fVar23 = *(float *)(in_RSI + 0xe8);
          fVar24 = *(float *)(in_RSI + 0xec);
        }
        fVar29 = 1.0 - uu;
        fVar38 = 1.0 - vv;
        auVar4 = ZEXT416((uint)(uu * uu * uu));
        auVar4 = vshufps_avx(auVar4,auVar4,0);
        fVar33 = auVar4._0_4_;
        fVar34 = auVar4._4_4_;
        fVar35 = auVar4._8_4_;
        fVar36 = auVar4._12_4_;
        auVar4 = ZEXT416((uint)(uu * uu * 3.0 * fVar29));
        auVar4 = vshufps_avx(auVar4,auVar4,0);
        fVar37 = auVar4._0_4_;
        fVar39 = auVar4._4_4_;
        fVar40 = auVar4._8_4_;
        fVar41 = auVar4._12_4_;
        auVar4 = ZEXT416((uint)(uu * 3.0 * fVar29 * fVar29));
        auVar4 = vshufps_avx(auVar4,auVar4,0);
        fVar42 = auVar4._0_4_;
        fVar43 = auVar4._4_4_;
        fVar44 = auVar4._8_4_;
        fVar45 = auVar4._12_4_;
        auVar4 = ZEXT416((uint)(fVar29 * fVar29 * fVar29));
        auVar4 = vshufps_avx(auVar4,auVar4,0);
        fVar29 = auVar4._0_4_;
        fVar30 = auVar4._4_4_;
        fVar31 = auVar4._8_4_;
        fVar32 = auVar4._12_4_;
        auVar4 = ZEXT416((uint)(vv * vv * vv));
        auVar4 = vshufps_avx(auVar4,auVar4,0);
        auVar5 = ZEXT416((uint)(vv * vv * 3.0 * fVar38));
        auVar5 = vshufps_avx(auVar5,auVar5,0);
        auVar13 = ZEXT416((uint)(vv * 3.0 * fVar38 * fVar38));
        auVar13 = vshufps_avx(auVar13,auVar13,0);
        auVar9._0_4_ = auVar13._0_4_ *
                       (fVar29 * *(float *)(in_RSI + 0x80) +
                       fVar42 * fVar12 + fVar33 * *(float *)(in_RSI + 0xb0) + fVar37 * fVar17) +
                       auVar5._0_4_ *
                       (fVar29 * *(float *)(in_RSI + 0xc0) +
                       fVar42 * fVar25 + fVar37 * fVar21 + fVar33 * *(float *)(in_RSI + 0xf0)) +
                       auVar4._0_4_ *
                       (fVar29 * *(float *)(in_RSI + 0x100) +
                       fVar42 * *(float *)(in_RSI + 0x110) +
                       fVar33 * *(float *)(in_RSI + 0x130) + fVar37 * *(float *)(in_RSI + 0x120));
        auVar9._4_4_ = auVar13._4_4_ *
                       (fVar30 * *(float *)(in_RSI + 0x84) +
                       fVar43 * fVar14 + fVar34 * *(float *)(in_RSI + 0xb4) + fVar39 * fVar18) +
                       auVar5._4_4_ *
                       (fVar30 * *(float *)(in_RSI + 0xc4) +
                       fVar43 * fVar26 + fVar39 * fVar22 + fVar34 * *(float *)(in_RSI + 0xf4)) +
                       auVar4._4_4_ *
                       (fVar30 * *(float *)(in_RSI + 0x104) +
                       fVar43 * *(float *)(in_RSI + 0x114) +
                       fVar34 * *(float *)(in_RSI + 0x134) + fVar39 * *(float *)(in_RSI + 0x124));
        auVar9._8_4_ = auVar13._8_4_ *
                       (fVar31 * *(float *)(in_RSI + 0x88) +
                       fVar44 * fVar15 + fVar35 * *(float *)(in_RSI + 0xb8) + fVar40 * fVar19) +
                       auVar5._8_4_ *
                       (fVar31 * *(float *)(in_RSI + 200) +
                       fVar44 * fVar27 + fVar40 * fVar23 + fVar35 * *(float *)(in_RSI + 0xf8)) +
                       auVar4._8_4_ *
                       (fVar31 * *(float *)(in_RSI + 0x108) +
                       fVar44 * *(float *)(in_RSI + 0x118) +
                       fVar35 * *(float *)(in_RSI + 0x138) + fVar40 * *(float *)(in_RSI + 0x128));
        auVar9._12_4_ =
             auVar13._12_4_ *
             (fVar32 * *(float *)(in_RSI + 0x8c) +
             fVar45 * fVar16 + fVar36 * *(float *)(in_RSI + 0xbc) + fVar41 * fVar20) +
             auVar5._12_4_ *
             (fVar32 * *(float *)(in_RSI + 0xcc) +
             fVar45 * fVar28 + fVar41 * fVar24 + fVar36 * *(float *)(in_RSI + 0xfc)) +
             auVar4._12_4_ *
             (fVar32 * *(float *)(in_RSI + 0x10c) +
             fVar45 * *(float *)(in_RSI + 0x11c) +
             fVar36 * *(float *)(in_RSI + 0x13c) + fVar41 * *(float *)(in_RSI + 300));
        auVar4 = ZEXT416((uint)(fVar38 * fVar38 * fVar38));
        auVar4 = vshufps_avx(auVar4,auVar4,0);
        auVar5._0_4_ = (fVar29 * *(float *)(in_RSI + 0x40) +
                       fVar42 * *(float *)(in_RSI + 0x50) +
                       fVar33 * *(float *)(in_RSI + 0x70) + fVar37 * *(float *)(in_RSI + 0x60)) *
                       auVar4._0_4_;
        auVar5._4_4_ = (fVar30 * *(float *)(in_RSI + 0x44) +
                       fVar43 * *(float *)(in_RSI + 0x54) +
                       fVar34 * *(float *)(in_RSI + 0x74) + fVar39 * *(float *)(in_RSI + 100)) *
                       auVar4._4_4_;
        auVar5._8_4_ = (fVar31 * *(float *)(in_RSI + 0x48) +
                       fVar44 * *(float *)(in_RSI + 0x58) +
                       fVar35 * *(float *)(in_RSI + 0x78) + fVar40 * *(float *)(in_RSI + 0x68)) *
                       auVar4._8_4_;
        auVar5._12_4_ =
             (fVar32 * *(float *)(in_RSI + 0x4c) +
             fVar45 * *(float *)(in_RSI + 0x5c) +
             fVar36 * *(float *)(in_RSI + 0x7c) + fVar41 * *(float *)(in_RSI + 0x6c)) *
             auVar4._12_4_;
        goto LAB_015e754c;
      }
      fVar12 = 0.0;
      fVar14 = 0.0;
      fVar15 = 0.0;
      fVar16 = 0.0;
      if (cVar1 != '\x06') goto LAB_015e7550;
      auVar4 = vshufps_avx(auVar4,auVar4,0);
      auVar13 = vshufps_avx(ZEXT416((uint)(1.0 - uu)),ZEXT416((uint)(1.0 - uu)),0);
      auVar5 = vshufps_avx(auVar5,auVar5,0);
      auVar6._0_4_ = auVar5._0_4_ *
                     (auVar4._0_4_ * *(float *)(in_RSI + 0x60) +
                     auVar13._0_4_ * *(float *)(in_RSI + 0x70));
      auVar6._4_4_ = auVar5._4_4_ *
                     (auVar4._4_4_ * *(float *)(in_RSI + 100) +
                     auVar13._4_4_ * *(float *)(in_RSI + 0x74));
      auVar6._8_4_ = auVar5._8_4_ *
                     (auVar4._8_4_ * *(float *)(in_RSI + 0x68) +
                     auVar13._8_4_ * *(float *)(in_RSI + 0x78));
      auVar6._12_4_ =
           auVar5._12_4_ *
           (auVar4._12_4_ * *(float *)(in_RSI + 0x6c) + auVar13._12_4_ * *(float *)(in_RSI + 0x7c));
      auVar5 = vshufps_avx(ZEXT416((uint)(1.0 - vv)),ZEXT416((uint)(1.0 - vv)),0);
      auVar10._0_4_ =
           auVar5._0_4_ *
           (auVar4._0_4_ * *(float *)(in_RSI + 0x50) + auVar13._0_4_ * *(float *)(in_RSI + 0x40));
      auVar10._4_4_ =
           auVar5._4_4_ *
           (auVar4._4_4_ * *(float *)(in_RSI + 0x54) + auVar13._4_4_ * *(float *)(in_RSI + 0x44));
      auVar10._8_4_ =
           auVar5._8_4_ *
           (auVar4._8_4_ * *(float *)(in_RSI + 0x58) + auVar13._8_4_ * *(float *)(in_RSI + 0x48));
      auVar10._12_4_ =
           auVar5._12_4_ *
           (auVar4._12_4_ * *(float *)(in_RSI + 0x5c) + auVar13._12_4_ * *(float *)(in_RSI + 0x4c));
    }
    uVar8 = auVar10._0_8_;
    uVar3 = auVar6._0_8_;
    fVar12 = auVar10._0_4_ + auVar6._0_4_;
    fVar14 = auVar10._4_4_ + auVar6._4_4_;
    fVar15 = auVar10._8_4_ + auVar6._8_4_;
    fVar16 = auVar10._12_4_ + auVar6._12_4_;
  }
LAB_015e7550:
  *(float *)&(patch->root_ref).data.super_atomic<long>.super___atomic_base<long>._M_i = fVar12;
  *(float *)((long)&(patch->root_ref).data.super_atomic<long>.super___atomic_base<long>._M_i + 4) =
       fVar14;
  *(float *)&patch->mtx = fVar15;
  *(float *)(patch->u + 1) = fVar16;
  VVar46.field_0._8_8_ = uVar8;
  VVar46.field_0._0_8_ = uVar3;
  return (Vec3fa)VVar46.field_0;
}

Assistant:

Vec3fa patchEval(const SubdivPatch1Base& patch, const float uu, const float vv) 
    {
      if (likely(patch.type == SubdivPatch1Base::BEZIER_PATCH))
        return ((BezierPatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::BSPLINE_PATCH))
        return ((BSplinePatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::GREGORY_PATCH))
        return ((DenseGregoryPatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::BILINEAR_PATCH))
        return ((BilinearPatch3fa*)patch.patch_v)->eval(uu,vv);
      return Vec3fa( zero );
    }